

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::
get_value<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
          (Attribute *this,
          vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *v)

{
  pointer ppVar1;
  pointer ppVar2;
  optional<std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>_>
  local_30;
  
  if ((v != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)0x0) &&
     (primvar::PrimVar::
      get_value<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                (&local_30,&this->_var), local_30.has_value_ == true)) {
    ppVar1 = (v->
             super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (v->
             super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (v->super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_30.contained.data._0_8_;
    (v->super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_30.contained._8_8_;
    (v->super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_30.contained._16_8_;
    if (ppVar1 == (pointer)0x0) {
      return true;
    }
    operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1);
    return true;
  }
  return false;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }